

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O3

double __thiscall icu_63::Formattable::getDouble(Formattable *this,UErrorCode *status)

{
  Type TVar1;
  UnicodeString *pUVar2;
  long lVar3;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    do {
      TVar1 = this->fType;
      if (TVar1 != kObject) {
        if (TVar1 == kDouble) {
          return (double)(this->fValue).fObject;
        }
        if ((TVar1 == kInt64) || (TVar1 == kLong)) {
          return (double)(this->fValue).fInt64;
        }
        break;
      }
      pUVar2 = (this->fValue).fString;
      if (pUVar2 == (UnicodeString *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return 0.0;
      }
      lVar3 = __dynamic_cast(pUVar2,&UObject::typeinfo,&Measure::typeinfo,0);
      this = (Formattable *)&pUVar2->fUnion;
    } while (lVar3 != 0);
    *status = U_INVALID_FORMAT_ERROR;
  }
  return 0.0;
}

Assistant:

double
Formattable::getDouble(UErrorCode& status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
        
    switch (fType) {
    case Formattable::kLong: 
    case Formattable::kInt64: // loses precision
        return (double)fValue.fInt64;
    case Formattable::kDouble:
        return fValue.fDouble;
    case Formattable::kObject:
        if (fValue.fObject == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }
        // TODO Later replace this with instanceof call
        if (instanceOfMeasure(fValue.fObject)) {
            return ((const Measure*) fValue.fObject)->
                getNumber().getDouble(status);
        }
        U_FALLTHROUGH;
    default:
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
}